

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::DvpVerifyDynamicAllocation
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffer)

{
  int iVar1;
  Uint64 UVar2;
  Uint32 UVar3;
  Int32 IVar4;
  Char *pCVar5;
  VkBuffer_T *pVVar6;
  BufferDesc *Args;
  size_type sVar7;
  Uint64 UVar8;
  char (*in_RCX) [32];
  char (*in_R8) [94];
  char (*in_stack_fffffffffffffe48) [156];
  undefined8 uVar9;
  Int32 local_134;
  undefined1 local_130 [8];
  string msg_6;
  undefined1 local_108 [8];
  string msg_5;
  undefined1 local_e0 [8];
  string msg_4;
  MappedBuffer *MappedBuff;
  string msg_3;
  string msg_2;
  undefined1 local_70 [4];
  Uint32 DynamicBufferId;
  string msg_1;
  BufferDesc *BuffDesc;
  undefined1 local_38 [8];
  string msg;
  BufferVkImpl *pBuffer_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = pBuffer;
  if (pBuffer == (BufferVkImpl *)0x0) {
    FormatString<char[26],char[19]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xe3ee32,
               (char (*) [19])in_RCX);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [32])0x8f1;
    DebugAssertionFailed
              (pCVar5,"DvpVerifyDynamicAllocation",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x8f1);
    std::__cxx11::string::~string((string *)local_38);
  }
  pVVar6 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                     ((VulkanObjectWrapper *)(msg.field_2._8_8_ + 0x98));
  if (pVVar6 == (VkBuffer_T *)0x0) {
    msg_1.field_2._8_8_ =
         (size_type)
         DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
         GetDesc(msg.field_2._8_8_);
    if (((BufferDesc *)msg_1.field_2._8_8_)->Usage != USAGE_DYNAMIC) {
      FormatString<char[26],char[32]>
                ((string *)local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BuffDesc.Usage == USAGE_DYNAMIC",in_RCX);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8f7);
      std::__cxx11::string::~string((string *)local_70);
    }
    UVar3 = BufferBase<Diligent::EngineVkImplTraits>::GetDynamicBufferId
                      ((BufferBase<Diligent::EngineVkImplTraits> *)msg.field_2._8_8_);
    if (UVar3 == 0xffffffff) {
      Args = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                        *)msg.field_2._8_8_);
      FormatString<char[17],char_const*,char[34]>
                ((string *)((long)&msg_3.field_2 + 8),(Diligent *)"Dynamic buffer \'",
                 (char (*) [17])Args,(char **)"\' does not have dynamic buffer ID",
                 (char (*) [34])in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8fa);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    sVar7 = std::
            vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
            ::size(&this->m_MappedBuffers);
    if (UVar3 < sVar7) {
      msg_4.field_2._8_8_ =
           std::
           vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
           ::operator[](&this->m_MappedBuffers,(ulong)UVar3);
      uVar9 = msg_1.field_2._8_8_;
      if ((((const_reference)msg_4.field_2._8_8_)->Allocation).pDynamicMemMgr ==
          (VulkanDynamicMemoryManager *)0x0) {
        msg_5.field_2._M_local_buf[0xf] =
             (char)DeviceContextBase<Diligent::EngineVkImplTraits>::GetContextId
                             ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
        FormatString<char[17],char_const*,char[57],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[73]>
                  ((string *)local_e0,(Diligent *)"Dynamic buffer \'",(char (*) [17])uVar9,
                   (char **)"\' has not been mapped before its first use. Context Id: ",
                   (char (*) [57])((long)&msg_5.field_2 + 0xf),
                   (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)0xe50427,
                   (char (*) [73])in_stack_fffffffffffffe48);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DvpVerifyDynamicAllocation",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x904);
        std::__cxx11::string::~string((string *)local_e0);
      }
      UVar2 = *(Uint64 *)(msg_4.field_2._8_8_ + 0x18);
      UVar8 = DeviceContextBase<Diligent::EngineVkImplTraits>::GetFrameNumber
                        ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
      uVar9 = msg_1.field_2._8_8_;
      if (UVar2 != UVar8) {
        msg_6.field_2._8_8_ =
             DeviceContextBase<Diligent::EngineVkImplTraits>::GetFrameNumber
                       ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
        FormatString<char[39],char_const*,char[12],unsigned_long,char[156]>
                  ((string *)local_108,(Diligent *)"Dynamic allocation of dynamic buffer \'",
                   (char (*) [39])uVar9,(char **)"\' in frame ",
                   (char (*) [12])((long)&msg_6.field_2 + 8),
                   (unsigned_long *)
                   " is out-of-date. Note: contents of all dynamic resources is discarded at the end of every frame. A buffer must be mapped before its first use in any frame."
                   ,in_stack_fffffffffffffe48);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DvpVerifyDynamicAllocation",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x907);
        std::__cxx11::string::~string((string *)local_108);
      }
      iVar1 = *(int *)(msg_4.field_2._8_8_ + 0x20);
      IVar4 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             *)msg.field_2._8_8_);
      if (iVar1 != IVar4) {
        uVar9 = msg_1.field_2._8_8_;
        local_134 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                    ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                                   *)msg.field_2._8_8_);
        FormatString<char[37],char_const*,char[10],int,char[37],int,char[106]>
                  ((string *)local_130,(Diligent *)"Dynamic buffer ID mismatch. Buffer \'",
                   (char (*) [37])uVar9,(char **)"\' has ID ",(char (*) [10])&local_134,
                   (int *)" but the ID of the mapped buffer is ",
                   (char (*) [37])(msg_4.field_2._8_8_ + 0x20),
                   (int *)
                   ". This indicates that dynamic space has been reassigned to a different buffer, which has not been mapped."
                   ,(char (*) [106])uVar9);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"DvpVerifyDynamicAllocation",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x90a);
        std::__cxx11::string::~string((string *)local_130);
      }
    }
    else {
      FormatString<char[17],char_const*,char[94]>
                ((string *)&MappedBuff,(Diligent *)"Dynamic buffer \'",
                 (char (*) [17])msg_1.field_2._8_8_,
                 (char **)
                 "\' has not been mapped. Note: memory for dynamic buffers is allocated when a buffer is mapped."
                 ,in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"DvpVerifyDynamicAllocation",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8fe);
      std::__cxx11::string::~string((string *)&MappedBuff);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::DvpVerifyDynamicAllocation(const BufferVkImpl* pBuffer) const
{
    VERIFY_EXPR(pBuffer != nullptr);

    if (pBuffer->m_VulkanBuffer != VK_NULL_HANDLE)
        return;

    const BufferDesc& BuffDesc = pBuffer->GetDesc();
    VERIFY_EXPR(BuffDesc.Usage == USAGE_DYNAMIC);

    const Uint32 DynamicBufferId = pBuffer->GetDynamicBufferId();
    VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", pBuffer->GetDesc().Name, "' does not have dynamic buffer ID");

    if (DynamicBufferId >= m_MappedBuffers.size())
    {
        DEV_ERROR("Dynamic buffer '", BuffDesc.Name, "' has not been mapped. Note: memory for dynamic buffers is allocated when a buffer is mapped.");
        return;
    }

    const MappedBuffer& MappedBuff = m_MappedBuffers[DynamicBufferId];
    DEV_CHECK_ERR(MappedBuff.Allocation.pDynamicMemMgr != nullptr, "Dynamic buffer '", BuffDesc.Name, "' has not been mapped before its first use. Context Id: ", GetContextId(),
                  ". Note: memory for dynamic buffers is allocated when a buffer is mapped.");

    DEV_CHECK_ERR(MappedBuff.Allocation.dvpFrameNumber == GetFrameNumber(), "Dynamic allocation of dynamic buffer '", BuffDesc.Name, "' in frame ", GetFrameNumber(),
                  " is out-of-date. Note: contents of all dynamic resources is discarded at the end of every frame. A buffer must be mapped before its first use in any frame.");

    DEV_CHECK_ERR(MappedBuff.DvpBufferUID == pBuffer->GetUniqueID(), "Dynamic buffer ID mismatch. Buffer '", BuffDesc.Name, "' has ID ", pBuffer->GetUniqueID(), " but the ID of the mapped buffer is ",
                  MappedBuff.DvpBufferUID, ". This indicates that dynamic space has been reassigned to a different buffer, which has not been mapped.");
}